

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ixgbe.c
# Opt level: O0

ixy_device * ixgbe_init(char *pci_addr,uint16_t rx_queues,uint16_t tx_queues)

{
  __uid_t _Var1;
  ixy_device *piVar2;
  char *pcVar3;
  uint8_t *puVar4;
  void *pvVar5;
  ushort in_DX;
  ushort in_SI;
  char *in_RDI;
  ixgbe_device *dev;
  char *in_stack_000016d0;
  ixgbe_device *in_stack_ffffffffffffffe0;
  
  _Var1 = getuid();
  if (_Var1 != 0) {
    fprintf(_stderr,"[WARN ] %s:%d %s(): Not running as root, this will probably fail\n",
            "/workspace/llm4binary/github/license_all_cmakelists_1510/Yumasi[P]ixy-vswitch/extern/ixy/src/driver/ixgbe.c"
            ,0x115,"ixgbe_init");
  }
  if (0x40 < in_SI) {
    fprintf(_stderr,"[ERROR] %s:%d %s(): cannot configure %d rx queues: limit is %d\n",
            "/workspace/llm4binary/github/license_all_cmakelists_1510/Yumasi[P]ixy-vswitch/extern/ixy/src/driver/ixgbe.c"
            ,0x118,"ixgbe_init",(ulong)in_SI,0x40);
    abort();
  }
  if (0x40 < in_DX) {
    fprintf(_stderr,"[ERROR] %s:%d %s(): cannot configure %d tx queues: limit is %d\n",
            "/workspace/llm4binary/github/license_all_cmakelists_1510/Yumasi[P]ixy-vswitch/extern/ixy/src/driver/ixgbe.c"
            ,0x11b,"ixgbe_init",(ulong)in_DX,0x40);
    abort();
  }
  piVar2 = (ixy_device *)malloc(0x58);
  pcVar3 = strdup(in_RDI);
  piVar2->pci_addr = pcVar3;
  piVar2->driver_name = driver_name;
  piVar2->num_rx_queues = in_SI;
  piVar2->num_tx_queues = in_DX;
  piVar2->rx_batch = ixgbe_rx_batch;
  piVar2->tx_batch = ixgbe_tx_batch;
  piVar2->read_stats = ixgbe_read_stats;
  piVar2->set_promisc = ixgbe_set_promisc;
  piVar2->get_link_speed = ixgbe_get_link_speed;
  puVar4 = pci_map_resource(in_stack_000016d0);
  piVar2[1].pci_addr = (char *)puVar4;
  pcVar3 = (char *)calloc((ulong)in_SI,0x8018);
  piVar2[1].driver_name = pcVar3;
  pvVar5 = calloc((ulong)in_DX,0x8010);
  *(void **)&piVar2[1].num_rx_queues = pvVar5;
  reset_and_init(in_stack_ffffffffffffffe0);
  return piVar2;
}

Assistant:

struct ixy_device* ixgbe_init(const char* pci_addr, uint16_t rx_queues, uint16_t tx_queues) {
	if (getuid()) {
		warn("Not running as root, this will probably fail");
	}
	if (rx_queues > MAX_QUEUES) {
		error("cannot configure %d rx queues: limit is %d", rx_queues, MAX_QUEUES);
	}
	if (tx_queues > MAX_QUEUES) {
		error("cannot configure %d tx queues: limit is %d", tx_queues, MAX_QUEUES);
	}
	struct ixgbe_device* dev = (struct ixgbe_device*) malloc(sizeof(struct ixgbe_device));
	dev->ixy.pci_addr = strdup(pci_addr);
	dev->ixy.driver_name = driver_name;
	dev->ixy.num_rx_queues = rx_queues;
	dev->ixy.num_tx_queues = tx_queues;
	dev->ixy.rx_batch = ixgbe_rx_batch;
	dev->ixy.tx_batch = ixgbe_tx_batch;
	dev->ixy.read_stats = ixgbe_read_stats;
	dev->ixy.set_promisc = ixgbe_set_promisc;
	dev->ixy.get_link_speed = ixgbe_get_link_speed;
	dev->addr = pci_map_resource(pci_addr);
	dev->rx_queues = calloc(rx_queues, sizeof(struct ixgbe_rx_queue) + sizeof(void*) * MAX_RX_QUEUE_ENTRIES);
	dev->tx_queues = calloc(tx_queues, sizeof(struct ixgbe_tx_queue) + sizeof(void*) * MAX_TX_QUEUE_ENTRIES);
	reset_and_init(dev);
	return &dev->ixy;
}